

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_12::WriteBatchItemPrinter::Put
          (WriteBatchItemPrinter *this,Slice *key,Slice *value)

{
  WritableFile *pWVar1;
  Slice local_60;
  Status local_50;
  allocator local_41;
  string local_40 [8];
  string r;
  Slice *value_local;
  Slice *key_local;
  WriteBatchItemPrinter *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"  put \'",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  AppendEscapedStringTo((string *)local_40,key);
  std::__cxx11::string::operator+=(local_40,"\' \'");
  AppendEscapedStringTo((string *)local_40,value);
  std::__cxx11::string::operator+=(local_40,"\'\n");
  pWVar1 = this->dst_;
  Slice::Slice(&local_60,(string *)local_40);
  (*pWVar1->_vptr_WritableFile[2])(&local_50,pWVar1,&local_60);
  Status::~Status(&local_50);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Put(const Slice& key, const Slice& value) override {
    std::string r = "  put '";
    AppendEscapedStringTo(&r, key);
    r += "' '";
    AppendEscapedStringTo(&r, value);
    r += "'\n";
    dst_->Append(r);
  }